

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O2

void __thiscall
print_fileinfo::perform(print_fileinfo *this,filesystemcollection *fslist,readercollection *rdlist)

{
  undefined8 *puVar1;
  FileContainer_ptr fs;
  
  filesystemcollection::getbyname((filesystemcollection *)&fs,(string *)fslist);
  if (fs.super___shared_ptr<FileContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0
     ) {
    (*(fs.super___shared_ptr<FileContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_FileContainer
      [6])(fs.super___shared_ptr<FileContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&this->_romname);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&fs.super___shared_ptr<FileContainer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    return;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = "dump: invalid fsname";
  __cxa_throw(puVar1,&char_const*::typeinfo,0);
}

Assistant:

virtual void perform(filesystemcollection& fslist, readercollection& rdlist)
    {
        FileContainer_ptr fs= fslist.getbyname(_fsname);
        if (!fs) throw "dump: invalid fsname";

        fs->printfileinfo(_romname);
    }